

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_4x4(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int aiStack_68 [10];
  int workspace [16];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  lVar5 = 0;
  do {
    iVar6 = (int)coef_block[lVar5] * *(int *)((long)pvVar3 + lVar5 * 4);
    iVar8 = (int)coef_block[lVar5 + 0x10] * *(int *)((long)pvVar3 + lVar5 * 4 + 0x40);
    iVar1 = iVar8 + iVar6;
    iVar6 = iVar6 - iVar8;
    lVar12 = (long)*(int *)((long)pvVar3 + lVar5 * 4 + 0x20) * (long)coef_block[lVar5 + 8];
    lVar10 = (long)*(int *)((long)pvVar3 + lVar5 * 4 + 0x60) * (long)coef_block[lVar5 + 0x18];
    lVar11 = (lVar10 + lVar12) * 0x1151;
    iVar8 = (int)(lVar12 * 0x187e + lVar11 + 0x400U >> 0xb);
    aiStack_68[lVar5] = iVar8 + iVar1 * 4;
    workspace[lVar5 + 2] = iVar1 * 4 - iVar8;
    iVar1 = (int)(lVar11 + lVar10 * -0x3b21 + 0x400U >> 0xb);
    aiStack_68[lVar5 + 4] = iVar1 + iVar6 * 4;
    aiStack_68[lVar5 + 8] = iVar6 * 4 - iVar1;
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 4);
  uVar4 = (ulong)output_col;
  lVar5 = 0;
  do {
    lVar10 = *(long *)((long)output_buf + lVar5);
    iVar1 = *(int *)((long)aiStack_68 + lVar5 * 2);
    iVar8 = *(int *)((long)aiStack_68 + lVar5 * 2 + 4);
    iVar6 = *(int *)((long)aiStack_68 + lVar5 * 2 + 8);
    iVar9 = (iVar1 + iVar6 + 0x10) * 0x2000;
    iVar7 = ((iVar1 + 0x10) - iVar6) * 0x2000;
    iVar1 = *(int *)((long)aiStack_68 + lVar5 * 2 + 0xc);
    iVar6 = (iVar1 + iVar8) * 0x1151;
    iVar8 = iVar8 * 0x187e + iVar6;
    iVar6 = iVar1 * -0x3b21 + iVar6;
    *(JSAMPLE *)(lVar10 + uVar4) = pJVar2[(ulong)((uint)(iVar8 + iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 3 + uVar4) = pJVar2[(ulong)((uint)(iVar9 - iVar8) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar10 + 1 + uVar4) = pJVar2[(ulong)((uint)(iVar6 + iVar7) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar10 + 2 + uVar4) = pJVar2[(ulong)((uint)(iVar7 - iVar6) >> 0x12 & 0x3ff) + 0x80]
    ;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_4x4 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JCOEFPTR coef_block,
	       JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp2, tmp10, tmp12;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[4*4];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    
    tmp10 = (tmp0 + tmp2) << PASS1_BITS;
    tmp12 = (tmp0 - tmp2) << PASS1_BITS;

    /* Odd part */
    /* Same rotation as in the even part of the 8x8 LL&M IDCT */

    z2 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);               /* c6 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);
    tmp0 = RIGHT_SHIFT(z1 + MULTIPLY(z2, FIX_0_765366865), /* c2-c6 */
		       CONST_BITS-PASS1_BITS);
    tmp2 = RIGHT_SHIFT(z1 - MULTIPLY(z3, FIX_1_847759065), /* c2+c6 */
		       CONST_BITS-PASS1_BITS);

    /* Final output stage */

    wsptr[4*0] = (int) (tmp10 + tmp0);
    wsptr[4*3] = (int) (tmp10 - tmp0);
    wsptr[4*1] = (int) (tmp12 + tmp2);
    wsptr[4*2] = (int) (tmp12 - tmp2);
  }

  /* Pass 2: process 4 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp2 = (INT32) wsptr[2];

    tmp10 = (tmp0 + tmp2) << CONST_BITS;
    tmp12 = (tmp0 - tmp2) << CONST_BITS;

    /* Odd part */
    /* Same rotation as in the even part of the 8x8 LL&M IDCT */

    z2 = (INT32) wsptr[1];
    z3 = (INT32) wsptr[3];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);   /* c6 */
    tmp0 = z1 + MULTIPLY(z2, FIX_0_765366865); /* c2-c6 */
    tmp2 = z1 - MULTIPLY(z3, FIX_1_847759065); /* c2+c6 */

    /* Final output stage */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += 4;		/* advance pointer to next row */
  }
}